

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void explainComposite(Parse *pParse,int op,int iSub1,int iSub2,int bUseTmp)

{
  Vdbe *p;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  char *pcVar1;
  char *pcVar2;
  
  if (pParse->explain == '\x02') {
    p = pParse->pVdbe;
    pcVar1 = "USING TEMP B-TREE ";
    if (bUseTmp == 0) {
      pcVar1 = "";
    }
    if (op - 0x71U < 3) {
      pcVar2 = (&PTR_anon_var_dwarf_be6a9_001bcd68)[op - 0x71U];
    }
    else {
      pcVar2 = "UNION";
    }
    pcVar1 = sqlite3MPrintf(pParse->db,"COMPOUND SUBQUERIES %d AND %d %s(%s)",
                            CONCAT44(in_register_00000014,iSub1),
                            CONCAT44(in_register_0000000c,iSub2),pcVar1,pcVar2);
    sqlite3VdbeAddOp4(p,0x96,pParse->iSelectId,0,0,pcVar1,-1);
  }
  return;
}

Assistant:

static void explainComposite(
  Parse *pParse,                  /* Parse context */
  int op,                         /* One of TK_UNION, TK_EXCEPT etc. */
  int iSub1,                      /* Subquery id 1 */
  int iSub2,                      /* Subquery id 2 */
  int bUseTmp                     /* True if a temp table was used */
){
  assert( op==TK_UNION || op==TK_EXCEPT || op==TK_INTERSECT || op==TK_ALL );
  if( pParse->explain==2 ){
    Vdbe *v = pParse->pVdbe;
    char *zMsg = sqlite3MPrintf(
        pParse->db, "COMPOUND SUBQUERIES %d AND %d %s(%s)", iSub1, iSub2,
        bUseTmp?"USING TEMP B-TREE ":"", selectOpName(op)
    );
    sqlite3VdbeAddOp4(v, OP_Explain, pParse->iSelectId, 0, 0, zMsg, P4_DYNAMIC);
  }
}